

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

PLYValue * __thiscall gvr::PLYWriter::nextValue(PLYWriter *this)

{
  int iVar1;
  long lVar2;
  pointer ppPVar3;
  PLYElement *pPVar4;
  pointer pPVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  IOException *this_00;
  ulong uVar9;
  bool bVar10;
  string local_40;
  
  iVar1 = this->plist;
  this->plist = iVar1 + -1;
  if (iVar1 < 1) {
    iVar1 = this->pprop;
    this->pprop = iVar1 + -1;
    if (iVar1 < 2) {
      lVar2 = this->pinst;
      this->pinst = lVar2 + -1;
      if (lVar2 < 2) {
        this->element = (PLYElement *)0x0;
        ppPVar3 = (this->list).
                  super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = (long)(this->list).
                      super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3;
        uVar7 = this->pelem + 1;
        bVar10 = uVar7 < uVar9;
        uVar8 = uVar7;
        if (bVar10) {
          do {
            pPVar4 = ppPVar3[uVar7];
            if ((0 < pPVar4->size) &&
               ((int)((ulong)((long)*(pointer *)
                                     ((long)&(pPVar4->list).
                                             super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                             ._M_impl + 8) -
                             *(long *)&(pPVar4->list).
                                       super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                       ._M_impl.super__Vector_impl_data) >> 6) != 0)) {
              this->pelem = uVar7;
              if (!bVar10) goto LAB_0010fd04;
              pPVar4 = ppPVar3[uVar7];
              this->element = pPVar4;
              this->pinst = pPVar4->size;
              goto LAB_0010fd80;
            }
            uVar7 = uVar7 + 1;
            bVar10 = uVar7 < uVar9;
            uVar8 = uVar9;
          } while (uVar7 != uVar9);
        }
        this->pelem = uVar8;
LAB_0010fd04:
        std::ostream::flush();
        this_00 = (IOException *)__cxa_allocate_exception(0x28);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Attempt to write more data than specified in the PLY header"
                   ,"");
        gutil::IOException::IOException(this_00,&local_40);
        __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
      }
LAB_0010fd80:
      this->pprop = (int)((ulong)((long)(this->element->list).
                                        super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->element->list).
                                       super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 6);
      if (this->enc == ply_ascii) {
        cVar6 = (char)this + 'H';
        std::ios::widen((char)*(undefined8 *)(*(long *)&this->out + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
      }
    }
    this->plist = 0;
  }
  pPVar5 = (this->element->list).
           super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return pPVar5[(long)(int)((ulong)((long)(this->element->list).
                                          super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5)
                           >> 6) - (long)this->pprop].value;
}

Assistant:

PLYValue &PLYWriter::nextValue()
{
  // increment internal pointers to the next (list) value, instance or
  // element, according to the specified header

  plist--;

  if (plist < 0)
  {
    pprop--;

    if (pprop <= 0)
    {
      pinst--;

      if (pinst <= 0)
      {
        element=0;

        pelem++;

        while (pelem < list.size() && (list[pelem]->getInstances() <= 0 ||
                                       list[pelem]->getPropertyCount() == 0))
        {
          pelem++;
        }

        if (pelem >= list.size())
        {
          out.flush();
          throw gutil::IOException("Attempt to write more data than specified in the PLY header");
        }

        element=list[pelem];
        pinst=element->getInstances();
      }

      pprop=element->getPropertyCount();

      if (enc == ply_ascii)
      {
        out << std::endl;
      }
    }

    plist=0;
  }

  return element->getProperty(element->getPropertyCount()-pprop).getValue();
}